

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::multiaggregation(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp,bool *again)

{
  int *piVar1;
  uint *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  int p_dimen;
  fpclass_type fVar8;
  int32_t iVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  int iVar12;
  fpclass_type fVar13;
  int32_t iVar14;
  int rowNumber;
  int iVar15;
  uint uVar16;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar17;
  undefined8 uVar18;
  pointer pnVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  long lVar22;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar23;
  type_conflict5 tVar24;
  bool bVar25;
  type_conflict5 tVar26;
  type_conflict5 tVar27;
  int iVar28;
  int iVar29;
  int t;
  double *pdVar30;
  MultiAggregationPS *this_00;
  SPxOut *pSVar31;
  long lVar32;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar33;
  int l;
  uint uVar34;
  ulong uVar35;
  int k;
  long lVar36;
  long lVar37;
  Item *pIVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  Item *pIVar42;
  int maxOtherLocks;
  Item *local_950;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_948;
  ulong local_940;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  int local_85c;
  int local_858;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minRes;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRes;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  updateRow;
  double local_680;
  uint local_678 [2];
  uint auStack_670 [2];
  uint local_668 [2];
  uint auStack_660 [2];
  uint local_658 [4];
  uint local_648 [2];
  uint auStack_640 [2];
  uint local_638 [2];
  uint auStack_630 [2];
  uint local_628 [4];
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_618;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_608;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  element_type *local_588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_580;
  uint local_578 [2];
  uint auStack_570 [2];
  uint local_568 [2];
  int local_560;
  bool local_55c;
  fpclass_type local_558;
  int32_t local_554;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_508;
  element_type *local_4c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4c0;
  uint local_4b8 [2];
  uint auStack_4b0 [2];
  uint local_4a8 [2];
  int local_4a0;
  bool local_49c;
  fpclass_type local_498;
  int32_t local_494;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar7 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  p_dimen = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&upLocks,p_dimen);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&downLocks,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_940 = (ulong)(uint)(lp->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
  t = 0;
  local_858 = 0;
  local_85c = 0;
  local_948 = this;
LAB_002a1789:
  do {
    pSVar23 = local_948;
    if ((int)local_940 < 1) {
      uVar34 = local_85c + local_858;
      if (uVar34 != 0 && SCARRY4(local_85c,local_858) == (int)uVar34 < 0) {
        piVar1 = &(local_948->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remRows;
        *piVar1 = *piVar1 + local_85c;
        piVar1 = &(local_948->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remCols;
        *piVar1 = *piVar1 + local_858;
        piVar1 = &(local_948->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
        *piVar1 = *piVar1 + t;
        pSVar31 = (local_948->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar31 != (SPxOut *)0x0) && (3 < (int)pSVar31->m_verbosity)) {
          lhs.m_backend.data._M_elems[0] = pSVar31->m_verbosity;
          rhs.m_backend.data._M_elems[0] = 4;
          (*pSVar31->_vptr_SPxOut[2])();
          pSVar31 = soplex::operator<<((pSVar23->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (multi-aggregation) removed ");
          pSVar31 = soplex::operator<<(pSVar31,local_85c);
          pSVar31 = soplex::operator<<(pSVar31," rows, ");
          pSVar31 = soplex::operator<<(pSVar31,local_858);
          pSVar31 = soplex::operator<<(pSVar31," cols, ");
          pSVar31 = soplex::operator<<(pSVar31,t);
          pSVar31 = soplex::operator<<(pSVar31," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar31->m_streams[pSVar31->m_verbosity]);
          pSVar31 = (pSVar23->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar31->_vptr_SPxOut[2])(pSVar31,&lhs);
        }
        minRes.m_backend.data._M_elems[0] = uVar34;
        rhs.m_backend.data._M_elems._0_8_ = (long)p_dimen + (long)iVar7;
        lhs.m_backend.fpclass = cpp_dec_float_finite;
        lhs.m_backend.prec_elem = 10;
        lhs.m_backend.data._M_elems[0] = 0;
        lhs.m_backend.data._M_elems[1] = 0;
        lhs.m_backend.data._M_elems[2] = 0;
        lhs.m_backend.data._M_elems[3] = 0;
        lhs.m_backend.data._M_elems[4] = 0;
        lhs.m_backend.data._M_elems[5] = 0;
        lhs.m_backend.data._M_elems[6] = 0;
        lhs.m_backend.data._M_elems[7] = 0;
        lhs.m_backend.data._M_elems._32_5_ = 0;
        lhs.m_backend.data._M_elems[9]._1_3_ = 0;
        lhs.m_backend.exp = 0;
        lhs.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (&lhs.m_backend,
                   &(pSVar23->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend,(longlong *)&rhs);
        tVar24 = boost::multiprecision::operator>((int *)&minRes,&lhs);
        if (tVar24) {
          *again = true;
        }
      }
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&downLocks);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&upLocks);
      return OKAY;
    }
    uVar35 = local_940 - 1;
    uVar39 = uVar35 & 0xffffffff;
    lVar41 = uVar39 * 0x38;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&upLocks.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar39].m_backend,0);
    local_940 = uVar35;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&downLocks.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar39].m_backend,0);
    pIVar42 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem;
    iVar29 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[uVar39].idx;
    iVar28 = pIVar42[iVar29].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused;
  } while (iVar28 < 2);
  local_950 = pIVar42 + iVar29;
  lVar40 = 0;
  for (lVar36 = 0; lVar36 < iVar28; lVar36 = lVar36 + 1) {
    pNVar17 = (local_950->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    uVar18 = *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + lVar40 + 0x20);
    lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar18,0);
    lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar18 >> 0x28);
    puVar2 = (uint *)((long)(pNVar17->val).m_backend.data._M_elems + lVar40);
    lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
    lhs.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = (uint *)((long)(pNVar17->val).m_backend.data._M_elems + lVar40 + 0x10);
    lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    lhs.m_backend.data._M_elems[6] = puVar2[2];
    lhs.m_backend.data._M_elems[7] = puVar2[3];
    lhs.m_backend.exp = *(int *)((long)(&(pNVar17->val).m_backend.data + 1) + lVar40);
    lhs.m_backend.neg = *(bool *)((long)(&(pNVar17->val).m_backend.data + 1) + lVar40 + 4);
    lhs.m_backend._48_8_ = *(undefined8 *)((long)(&(pNVar17->val).m_backend.data + 1) + lVar40 + 8);
    iVar29 = *(int *)((long)(&((local_950->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val + 1) + lVar40);
    pnVar19 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar30 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&rhs.m_backend,-*pdVar30,(type *)0x0);
    tVar24 = boost::multiprecision::operator>
                       (pnVar19 + iVar29,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&rhs.m_backend);
    if (tVar24) {
      iVar29 = *(int *)((long)(&((local_950->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val + 1) + lVar40);
      pnVar19 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar30 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&minRes.m_backend,*pdVar30,(type *)0x0);
      tVar24 = boost::multiprecision::operator<
                         (pnVar19 + iVar29,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&minRes.m_backend);
      if (!tVar24) goto LAB_002a1931;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&rhs.m_backend,
                   upLocks.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar39,0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&rhs.m_backend,
                   downLocks.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar39,0);
    }
    else {
LAB_002a1931:
      iVar29 = *(int *)((long)(&((local_950->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val + 1) + lVar40);
      pnVar19 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar30 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&rhs.m_backend,-*pdVar30,(type *)0x0);
      tVar24 = boost::multiprecision::operator>
                         (pnVar19 + iVar29,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&rhs.m_backend);
      if (tVar24) {
        rhs.m_backend.data._M_elems._0_8_ = rhs.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar24 = boost::multiprecision::operator>(&lhs,(int *)&rhs.m_backend);
        if (tVar24) {
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&rhs.m_backend,
                       downLocks.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar39,0);
        }
        else {
          rhs.m_backend.data._M_elems._0_8_ = rhs.m_backend.data._M_elems._0_8_ & 0xffffffff00000000
          ;
          tVar24 = boost::multiprecision::operator<(&lhs,(int *)&rhs.m_backend);
          if (tVar24) {
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&rhs.m_backend,
                         upLocks.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar39,0);
          }
        }
      }
      else {
        iVar29 = *(int *)((long)(&((local_950->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val + 1) + lVar40);
        pnVar19 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar30 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&rhs.m_backend,*pdVar30,(type *)0x0);
        tVar24 = boost::multiprecision::operator<
                           (pnVar19 + iVar29,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&rhs.m_backend);
        if (tVar24) {
          rhs.m_backend.data._M_elems._0_8_ = rhs.m_backend.data._M_elems._0_8_ & 0xffffffff00000000
          ;
          tVar24 = boost::multiprecision::operator>(&lhs,(int *)&rhs.m_backend);
          if (tVar24) {
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&rhs.m_backend,
                         upLocks.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar39,0);
          }
          else {
            rhs.m_backend.data._M_elems._0_8_ =
                 rhs.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar24 = boost::multiprecision::operator<(&lhs,(int *)&rhs.m_backend);
            if (tVar24) {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&rhs.m_backend,
                           downLocks.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar39,0);
            }
          }
        }
      }
    }
    iVar28 = (local_950->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused;
    lVar40 = lVar40 + 0x3c;
  }
  lhs.m_backend.data._M_elems[0] = 1;
  tVar24 = boost::multiprecision::operator==
                     (upLocks.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar39,(int *)&lhs);
  if (!tVar24) goto code_r0x002a1adb;
  goto LAB_002a1b0b;
code_r0x002a1adb:
  rhs.m_backend.data._M_elems[0] = 1;
  tVar24 = boost::multiprecision::operator==
                     (downLocks.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar39,(int *)&rhs.m_backend);
  if (tVar24) {
LAB_002a1b0b:
    pnVar19 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_628._0_8_ = *(undefined8 *)(pnVar19[uVar39].m_backend.data._M_elems + 8);
    local_648 = pnVar19[uVar39].m_backend.data._M_elems[0];
    auStack_640 = *(uint (*) [2])(pnVar19[uVar39].m_backend.data._M_elems + 2);
    puVar2 = pnVar19[uVar39].m_backend.data._M_elems + 4;
    local_638 = *(uint (*) [2])puVar2;
    auStack_630 = *(uint (*) [2])(puVar2 + 2);
    iVar29 = pnVar19[uVar39].m_backend.exp;
    bVar4 = pnVar19[uVar39].m_backend.neg;
    fVar8 = pnVar19[uVar39].m_backend.fpclass;
    iVar9 = pnVar19[uVar39].m_backend.prec_elem;
    pnVar19 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_658._0_8_ = *(undefined8 *)(pnVar19[uVar39].m_backend.data._M_elems + 8);
    local_678 = pnVar19[uVar39].m_backend.data._M_elems[0];
    auStack_670 = *(uint (*) [2])(pnVar19[uVar39].m_backend.data._M_elems + 2);
    puVar2 = pnVar19[uVar39].m_backend.data._M_elems + 4;
    local_668 = *(uint (*) [2])puVar2;
    auStack_660 = *(uint (*) [2])(puVar2 + 2);
    iVar28 = pnVar19[uVar39].m_backend.exp;
    bVar5 = pnVar19[uVar39].m_backend.neg;
    fVar10 = pnVar19[uVar39].m_backend.fpclass;
    iVar11 = pnVar19[uVar39].m_backend.prec_elem;
    lVar40 = 0;
    for (lVar36 = 0;
        lVar36 < (local_950->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar36 = lVar36 + 1) {
      pNVar17 = (local_950->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      uVar18 = *(undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + lVar40 + 0x20);
      puVar3 = (undefined8 *)((long)(pNVar17->val).m_backend.data._M_elems + lVar40);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)*puVar3;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
      puVar2 = (uint *)((long)(pNVar17->val).m_backend.data._M_elems + lVar40 + 0x10);
      uVar20 = *(undefined8 *)puVar2;
      uVar21 = *(undefined8 *)(puVar2 + 2);
      iVar12 = *(int *)((long)(&(pNVar17->val).m_backend.data + 1) + lVar40);
      uVar6 = *(undefined1 *)((long)(&(pNVar17->val).m_backend.data + 1) + lVar40 + 4);
      fVar13 = *(fpclass_type *)((long)(&(pNVar17->val).m_backend.data + 1) + lVar40 + 8);
      iVar14 = *(int32_t *)((long)(&(pNVar17->val).m_backend.data + 1) + lVar40 + 0xc);
      rowNumber = *(int *)((long)(&pNVar17->val + 1) + lVar40);
      pnVar19 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_448.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar19[rowNumber].m_backend.data._M_elems + 8);
      lhs.m_backend.data._M_elems._32_5_ = local_448.m_backend.data._M_elems._32_5_;
      lhs.m_backend.data._M_elems[9]._1_3_ = local_448.m_backend.data._M_elems[9]._1_3_;
      lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar19[rowNumber].m_backend.data;
      lhs.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar19[rowNumber].m_backend.data._M_elems + 2);
      puVar2 = pnVar19[rowNumber].m_backend.data._M_elems + 4;
      lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_448.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      lhs.m_backend.data._M_elems[6] = local_448.m_backend.data._M_elems[6];
      lhs.m_backend.data._M_elems[7] = local_448.m_backend.data._M_elems[7];
      lhs.m_backend.exp = pnVar19[rowNumber].m_backend.exp;
      lhs.m_backend.neg = pnVar19[rowNumber].m_backend.neg;
      local_448.m_backend.fpclass = pnVar19[rowNumber].m_backend.fpclass;
      local_448.m_backend.prec_elem = pnVar19[rowNumber].m_backend.prec_elem;
      lhs.m_backend.prec_elem = local_448.m_backend.prec_elem;
      lhs.m_backend.fpclass = local_448.m_backend.fpclass;
      pnVar19 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_488.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar19[rowNumber].m_backend.data._M_elems + 8);
      rhs.m_backend.data._M_elems._32_5_ = local_488.m_backend.data._M_elems._32_5_;
      rhs.m_backend.data._M_elems[9]._1_3_ = local_488.m_backend.data._M_elems[9]._1_3_;
      rhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar19[rowNumber].m_backend.data;
      rhs.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar19[rowNumber].m_backend.data._M_elems + 2);
      puVar2 = pnVar19[rowNumber].m_backend.data._M_elems + 4;
      rhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_488.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      rhs.m_backend.data._M_elems._24_5_ = local_488.m_backend.data._M_elems._24_5_;
      rhs.m_backend.data._M_elems[7]._1_3_ = local_488.m_backend.data._M_elems[7]._1_3_;
      rhs.m_backend.exp = pnVar19[rowNumber].m_backend.exp;
      rhs.m_backend.neg = pnVar19[rowNumber].m_backend.neg;
      local_488.m_backend.fpclass = pnVar19[rowNumber].m_backend.fpclass;
      local_488.m_backend.prec_elem = pnVar19[rowNumber].m_backend.prec_elem;
      rhs.m_backend.prec_elem = local_488.m_backend.prec_elem;
      rhs.m_backend.fpclass = local_488.m_backend.fpclass;
      local_488.m_backend.data._M_elems._0_8_ = rhs.m_backend.data._M_elems._0_8_;
      local_488.m_backend.data._M_elems._8_8_ = rhs.m_backend.data._M_elems._8_8_;
      local_488.m_backend.data._M_elems._16_8_ = rhs.m_backend.data._M_elems._16_8_;
      local_488.m_backend.exp = rhs.m_backend.exp;
      local_488.m_backend.neg = rhs.m_backend.neg;
      local_448.m_backend.data._M_elems._0_8_ = lhs.m_backend.data._M_elems._0_8_;
      local_448.m_backend.data._M_elems._8_8_ = lhs.m_backend.data._M_elems._8_8_;
      local_448.m_backend.data._M_elems._16_8_ = lhs.m_backend.data._M_elems._16_8_;
      local_448.m_backend.exp = lhs.m_backend.exp;
      local_448.m_backend.neg = lhs.m_backend.neg;
      feastol(&local_68,local_948);
      bVar25 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_448,&local_488,&local_68);
      if (!bVar25) {
        pdVar30 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&minRes.m_backend,-*pdVar30,(type *)0x0);
        tVar24 = boost::multiprecision::operator>
                           (&lhs,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&minRes.m_backend);
        pdVar30 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&minRes.m_backend,*pdVar30,(type *)0x0);
        tVar26 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&rhs.m_backend,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&minRes.m_backend);
        iVar15 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem
                 [(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[rowNumber].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        if (iVar15 < 3) {
          maxOtherLocks = 0x7fffffff;
        }
        else if (iVar15 == 4) {
          maxOtherLocks = 2;
        }
        else if (iVar15 == 3) {
          maxOtherLocks = 3;
        }
        else {
          maxOtherLocks = 1;
        }
        if (tVar24) {
          minRes.m_backend.data._M_elems[0] = 0;
          minRes.m_backend.data._M_elems[1] = 0;
          tVar24 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(((local_950->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val).m_backend.data._M_elems + lVar40),
                              (double *)&minRes);
          if (!tVar24) {
LAB_002a1f62:
            minVal.m_backend.data._M_elems[0] = 0;
            minVal.m_backend.data._M_elems[1] = 0;
            tVar24 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(((local_950->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .m_elem)->val).m_backend.data._M_elems + lVar40),
                                (double *)&minVal);
            if (tVar24) {
              maxVal.m_backend.data._M_elems[0] = 0;
              maxVal.m_backend.data._M_elems[1] = 0;
              tVar24 = boost::multiprecision::operator>=
                                 ((lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar39,
                                  (double *)&maxVal);
              if (tVar24) {
                updateRow.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
                tVar24 = boost::multiprecision::operator==
                                   (upLocks.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar39,
                                    (int *)&updateRow);
                if (tVar24) {
                  tVar27 = boost::multiprecision::operator<=
                                     (downLocks.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar39,
                                      &maxOtherLocks);
                  goto LAB_002a1ff2;
                }
              }
            }
            goto LAB_002a1ff0;
          }
          maxRes.m_backend.data._M_elems[0] = 0;
          maxRes.m_backend.data._M_elems[1] = 0;
          tVar24 = boost::multiprecision::operator<=
                             ((lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).object.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar39,(double *)&maxRes);
          if (!tVar24) goto LAB_002a1f62;
          result.m_backend.data._M_elems[0] = 1;
          tVar24 = boost::multiprecision::operator==
                             (downLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar39,(int *)&result);
          if (!tVar24) goto LAB_002a1f62;
          tVar24 = boost::multiprecision::operator<=
                             (upLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar39,&maxOtherLocks);
          tVar27 = true;
          if (!tVar24) goto LAB_002a1f62;
        }
        else {
LAB_002a1ff0:
          tVar27 = false;
        }
LAB_002a1ff2:
        if (!tVar26) goto LAB_002a2127;
        minRes.m_backend.data._M_elems[0] = 0;
        minRes.m_backend.data._M_elems[1] = 0;
        tVar24 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(((local_950->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .m_elem)->val).m_backend.data._M_elems + lVar40),
                            (double *)&minRes);
        if (tVar24) {
          maxRes.m_backend.data._M_elems[0] = 0;
          maxRes.m_backend.data._M_elems[1] = 0;
          tVar24 = boost::multiprecision::operator>=
                             ((lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).object.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar39,(double *)&maxRes);
          if (!tVar24) goto LAB_002a2099;
          result.m_backend.data._M_elems[0] = 1;
          tVar24 = boost::multiprecision::operator==
                             (upLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar39,(int *)&result);
          if ((!tVar24) ||
             (tVar24 = boost::multiprecision::operator<=
                                 (downLocks.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar39,&maxOtherLocks)
             , !tVar24)) goto LAB_002a2099;
          tVar24 = true;
        }
        else {
LAB_002a2099:
          minVal.m_backend.data._M_elems[0] = 0;
          minVal.m_backend.data._M_elems[1] = 0;
          tVar24 = boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(((local_950->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val).m_backend.data._M_elems + lVar40),
                              (double *)&minVal);
          if (tVar24) {
            maxVal.m_backend.data._M_elems[0] = 0;
            maxVal.m_backend.data._M_elems[1] = 0;
            tVar24 = boost::multiprecision::operator<=
                               ((lp->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).object.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar39,(double *)&maxVal
                               );
            if (!tVar24) goto LAB_002a2127;
            updateRow.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
            tVar24 = boost::multiprecision::operator==
                               (downLocks.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar39,(int *)&updateRow
                               );
            if (!tVar24) goto LAB_002a2127;
            tVar24 = boost::multiprecision::operator<=
                               (upLocks.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar39,&maxOtherLocks);
          }
          else {
LAB_002a2127:
            tVar24 = false;
          }
          if ((tVar27 | tVar24) != 1) goto LAB_002a2a19;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&minRes.m_backend,0,(type *)0x0);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&maxRes.m_backend,0,(type *)0x0);
        computeMinMaxResidualActivity
                  (local_948,lp,rowNumber,(int)local_940,&minRes,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&maxRes.m_backend);
        if (tVar27 != false) {
          minVal.m_backend.fpclass = cpp_dec_float_finite;
          minVal.m_backend.prec_elem = 10;
          minVal.m_backend.data._M_elems[0] = 0;
          minVal.m_backend.data._M_elems[1] = 0;
          minVal.m_backend.data._M_elems[2] = 0;
          minVal.m_backend.data._M_elems[3] = 0;
          minVal.m_backend.data._M_elems[4] = 0;
          minVal.m_backend.data._M_elems[5] = 0;
          minVal.m_backend.data._M_elems._24_5_ = 0;
          minVal.m_backend.data._M_elems[7]._1_3_ = 0;
          minVal.m_backend.data._M_elems._32_5_ = 0;
          minVal.m_backend.data._M_elems[9]._1_3_ = 0;
          minVal.m_backend.exp = 0;
          minVal.m_backend.neg = false;
          maxVal.m_backend.fpclass = cpp_dec_float_finite;
          maxVal.m_backend.prec_elem = 10;
          maxVal.m_backend.data._M_elems[0] = 0;
          maxVal.m_backend.data._M_elems[1] = 0;
          maxVal.m_backend.data._M_elems[2] = 0;
          maxVal.m_backend.data._M_elems[3] = 0;
          maxVal.m_backend.data._M_elems[4] = 0;
          maxVal.m_backend.data._M_elems[5] = 0;
          maxVal.m_backend.data._M_elems._24_5_ = 0;
          maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
          maxVal.m_backend.data._M_elems._32_5_ = 0;
          maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
          maxVal.m_backend.exp = 0;
          maxVal.m_backend.neg = false;
          local_188.m_backend.data._M_elems[7] = lhs.m_backend.data._M_elems[7];
          local_188.m_backend.data._M_elems[6] = lhs.m_backend.data._M_elems[6];
          local_188.m_backend.data._M_elems[0] = lhs.m_backend.data._M_elems[0];
          local_188.m_backend.data._M_elems[1] = lhs.m_backend.data._M_elems[1];
          local_188.m_backend.data._M_elems[2] = lhs.m_backend.data._M_elems[2];
          local_188.m_backend.data._M_elems[3] = lhs.m_backend.data._M_elems[3];
          local_188.m_backend.data._M_elems[4] = lhs.m_backend.data._M_elems[4];
          local_188.m_backend.data._M_elems[5] = lhs.m_backend.data._M_elems[5];
          local_188.m_backend.data._M_elems[9]._1_3_ = lhs.m_backend.data._M_elems[9]._1_3_;
          local_188.m_backend.data._M_elems._32_5_ = lhs.m_backend.data._M_elems._32_5_;
          local_188.m_backend.exp = lhs.m_backend.exp;
          local_188.m_backend.neg = lhs.m_backend.neg;
          local_188.m_backend.fpclass = lhs.m_backend.fpclass;
          local_188.m_backend.prec_elem = lhs.m_backend.prec_elem;
          local_4c8 = ptr.
                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
          p_Stack_4c0 = ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_1c8.m_backend.data._M_elems[9]._1_3_ = minRes.m_backend.data._M_elems[9]._1_3_;
          local_1c8.m_backend.data._M_elems._32_5_ = minRes.m_backend.data._M_elems._32_5_;
          local_1c8.m_backend.data._M_elems[7]._1_3_ = minRes.m_backend.data._M_elems[7]._1_3_;
          local_1c8.m_backend.data._M_elems._24_5_ = minRes.m_backend.data._M_elems._24_5_;
          local_1c8.m_backend.data._M_elems[4] = minRes.m_backend.data._M_elems[4];
          local_1c8.m_backend.data._M_elems[5] = minRes.m_backend.data._M_elems[5];
          local_1c8.m_backend.data._M_elems[0] = minRes.m_backend.data._M_elems[0];
          local_1c8.m_backend.data._M_elems[1] = minRes.m_backend.data._M_elems[1];
          local_1c8.m_backend.data._M_elems[2] = minRes.m_backend.data._M_elems[2];
          local_1c8.m_backend.data._M_elems[3] = minRes.m_backend.data._M_elems[3];
          local_1c8.m_backend.exp = minRes.m_backend.exp;
          local_1c8.m_backend.neg = minRes.m_backend.neg;
          local_1c8.m_backend.fpclass = minRes.m_backend.fpclass;
          local_1c8.m_backend.prec_elem = minRes.m_backend.prec_elem;
          local_208.m_backend.data._M_elems[9]._1_3_ = maxRes.m_backend.data._M_elems[9]._1_3_;
          local_208.m_backend.data._M_elems._32_5_ = maxRes.m_backend.data._M_elems._32_5_;
          local_208.m_backend.data._M_elems[7]._1_3_ = maxRes.m_backend.data._M_elems[7]._1_3_;
          local_208.m_backend.data._M_elems._24_5_ = maxRes.m_backend.data._M_elems._24_5_;
          local_208.m_backend.data._M_elems[4] = maxRes.m_backend.data._M_elems[4];
          local_208.m_backend.data._M_elems[5] = maxRes.m_backend.data._M_elems[5];
          local_208.m_backend.data._M_elems[0] = maxRes.m_backend.data._M_elems[0];
          local_208.m_backend.data._M_elems[1] = maxRes.m_backend.data._M_elems[1];
          local_208.m_backend.data._M_elems[2] = maxRes.m_backend.data._M_elems[2];
          local_208.m_backend.data._M_elems[3] = maxRes.m_backend.data._M_elems[3];
          local_208.m_backend.exp = maxRes.m_backend.exp;
          local_208.m_backend.neg = maxRes.m_backend.neg;
          local_208.m_backend.fpclass = maxRes.m_backend.fpclass;
          local_208.m_backend.prec_elem = maxRes.m_backend.prec_elem;
          local_4b8 = (uint  [2])uVar20;
          auStack_4b0 = (uint  [2])uVar21;
          local_4a8 = (uint  [2])uVar18;
          local_4a0 = iVar12;
          local_49c = (bool)uVar6;
          local_498 = fVar13;
          local_494 = iVar14;
          computeMinMaxValues(local_948,lp,&local_188,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_4c8,&local_1c8,&local_208,&minVal,&maxVal);
          pdVar30 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,-*pdVar30,(type *)0x0);
          tVar26 = boost::multiprecision::operator>(&minVal,&result);
          if (!tVar26) goto LAB_002a25cf;
          local_248.m_backend.data._M_elems[9]._1_3_ = minVal.m_backend.data._M_elems[9]._1_3_;
          local_248.m_backend.data._M_elems._32_5_ = minVal.m_backend.data._M_elems._32_5_;
          local_248.m_backend.data._M_elems[7]._1_3_ = minVal.m_backend.data._M_elems[7]._1_3_;
          local_248.m_backend.data._M_elems._24_5_ = minVal.m_backend.data._M_elems._24_5_;
          local_248.m_backend.data._M_elems[4] = minVal.m_backend.data._M_elems[4];
          local_248.m_backend.data._M_elems[5] = minVal.m_backend.data._M_elems[5];
          local_248.m_backend.data._M_elems[0] = minVal.m_backend.data._M_elems[0];
          local_248.m_backend.data._M_elems[1] = minVal.m_backend.data._M_elems[1];
          local_248.m_backend.data._M_elems[2] = minVal.m_backend.data._M_elems[2];
          local_248.m_backend.data._M_elems[3] = minVal.m_backend.data._M_elems[3];
          local_248.m_backend.exp = minVal.m_backend.exp;
          local_248.m_backend.neg = minVal.m_backend.neg;
          local_248.m_backend.fpclass = minVal.m_backend.fpclass;
          local_248.m_backend.prec_elem = minVal.m_backend.prec_elem;
          local_508.m_backend.data._M_elems[0] = local_648[0];
          local_508.m_backend.data._M_elems[1] = local_648[1];
          local_508.m_backend.data._M_elems[2] = auStack_640[0];
          local_508.m_backend.data._M_elems[3] = auStack_640[1];
          local_508.m_backend.data._M_elems[4] = local_638[0];
          local_508.m_backend.data._M_elems[5] = local_638[1];
          local_508.m_backend.data._M_elems[6] = auStack_630[0];
          local_508.m_backend.data._M_elems[7] = auStack_630[1];
          local_508.m_backend.data._M_elems[8] = local_628[0];
          local_508.m_backend.data._M_elems[9] = local_628[1];
          local_508.m_backend.exp = iVar29;
          local_508.m_backend.neg = bVar4;
          local_508.m_backend.fpclass = fVar8;
          local_508.m_backend.prec_elem = iVar9;
          feastol(&local_a0,local_948);
          bVar25 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_248,&local_508,&local_a0);
          if (!bVar25) goto LAB_002a25cf;
          pdVar30 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&updateRow,*pdVar30,(type *)0x0);
          tVar26 = boost::multiprecision::operator<
                             (&maxVal,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&updateRow);
          if (!tVar26) goto LAB_002a25cf;
          local_288.m_backend.data._M_elems[9]._1_3_ = maxVal.m_backend.data._M_elems[9]._1_3_;
          local_288.m_backend.data._M_elems._32_5_ = maxVal.m_backend.data._M_elems._32_5_;
          local_288.m_backend.data._M_elems[7]._1_3_ = maxVal.m_backend.data._M_elems[7]._1_3_;
          local_288.m_backend.data._M_elems._24_5_ = maxVal.m_backend.data._M_elems._24_5_;
          local_288.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
          local_288.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
          local_288.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
          local_288.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
          local_288.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
          local_288.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
          local_288.m_backend.exp = maxVal.m_backend.exp;
          local_288.m_backend.neg = maxVal.m_backend.neg;
          local_288.m_backend.fpclass = maxVal.m_backend.fpclass;
          local_288.m_backend.prec_elem = maxVal.m_backend.prec_elem;
          local_548.m_backend.data._M_elems[0] = local_678[0];
          local_548.m_backend.data._M_elems[1] = local_678[1];
          local_548.m_backend.data._M_elems[2] = auStack_670[0];
          local_548.m_backend.data._M_elems[3] = auStack_670[1];
          local_548.m_backend.data._M_elems[4] = local_668[0];
          local_548.m_backend.data._M_elems[5] = local_668[1];
          local_548.m_backend.data._M_elems[6] = auStack_660[0];
          local_548.m_backend.data._M_elems[7] = auStack_660[1];
          local_548.m_backend.data._M_elems[8] = local_658[0];
          local_548.m_backend.data._M_elems[9] = local_658[1];
          local_548.m_backend.exp = iVar28;
          local_548.m_backend.neg = bVar5;
          local_548.m_backend.fpclass = fVar10;
          local_548.m_backend.prec_elem = iVar11;
          feastol(&local_d8,local_948);
          bVar25 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_288,&local_548,&local_d8);
          if (!bVar25) goto LAB_002a25cf;
          uVar34 = *(uint *)((long)(&((local_950->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem)->val + 1) + lVar40);
          bVar4 = true;
LAB_002a2a4d:
          if (-1 < (int)uVar34) {
            pIVar42 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem +
                      (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[uVar34].idx;
            pVVar33 = &(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right;
            if (bVar4) {
              pVVar33 = &(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left;
            }
            pnVar19 = (pVVar33->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar18 = *(undefined8 *)(pnVar19[uVar34].m_backend.data._M_elems + 8);
            lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar18,0);
            lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar18 >> 0x28);
            lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar19[uVar34].m_backend.data;
            lhs.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar19[uVar34].m_backend.data._M_elems + 2);
            puVar2 = pnVar19[uVar34].m_backend.data._M_elems + 4;
            lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar18 = *(undefined8 *)(puVar2 + 2);
            lhs.m_backend.data._M_elems[6] = (uint)uVar18;
            lhs.m_backend.data._M_elems[7] = (uint)((ulong)uVar18 >> 0x20);
            lhs.m_backend.exp = pnVar19[uVar34].m_backend.exp;
            lhs.m_backend.neg = pnVar19[uVar34].m_backend.neg;
            lhs.m_backend.fpclass = pnVar19[uVar34].m_backend.fpclass;
            lhs.m_backend.prec_elem = pnVar19[uVar34].m_backend.prec_elem;
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&rhs.m_backend,
                         (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)pIVar42,(int)local_940);
            this_00 = (MultiAggregationPS *)operator_new(0x160);
            local_408.m_backend.data._M_elems[9]._1_3_ = lhs.m_backend.data._M_elems[9]._1_3_;
            local_408.m_backend.data._M_elems._32_5_ = lhs.m_backend.data._M_elems._32_5_;
            local_408.m_backend.data._M_elems[7] = lhs.m_backend.data._M_elems[7];
            local_408.m_backend.data._M_elems[6] = lhs.m_backend.data._M_elems[6];
            local_408.m_backend.data._M_elems[4] = lhs.m_backend.data._M_elems[4];
            local_408.m_backend.data._M_elems[5] = lhs.m_backend.data._M_elems[5];
            local_408.m_backend.data._M_elems[0] = lhs.m_backend.data._M_elems[0];
            local_408.m_backend.data._M_elems[1] = lhs.m_backend.data._M_elems[1];
            local_408.m_backend.data._M_elems[2] = lhs.m_backend.data._M_elems[2];
            local_408.m_backend.data._M_elems[3] = lhs.m_backend.data._M_elems[3];
            local_408.m_backend.exp = lhs.m_backend.exp;
            local_408.m_backend.neg = lhs.m_backend.neg;
            local_408.m_backend.fpclass = lhs.m_backend.fpclass;
            local_408.m_backend.prec_elem = lhs.m_backend.prec_elem;
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_618,
                       &(this->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )._tolerances.
                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            MultiAggregationPS::MultiAggregationPS
                      (this_00,lp,local_948,uVar34,(int)local_940,&local_408,
                       (shared_ptr<soplex::Tolerances> *)&local_618);
            std::
            __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
            ::
            __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::MultiAggregationPS,void>
                      ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                        *)&ptr,this_00);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_618._M_refcount)
            ;
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
            ::push_back(&(this->m_hist).data,(value_type *)&ptr);
            pIVar38 = local_950;
            for (lVar36 = 0;
                lVar36 < (pIVar38->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused; lVar36 = lVar36 + 1) {
              uVar16 = (pIVar38->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem[lVar36].idx;
              if (uVar16 != uVar34) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::VectorBase(&updateRow,
                             (lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum);
                iVar29 = (pIVar38->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem[lVar36].idx;
                pnVar19 = (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar18 = *(undefined8 *)(pnVar19[iVar29].m_backend.data._M_elems + 8);
                minRes.m_backend.data._M_elems._32_5_ = SUB85(uVar18,0);
                minRes.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar18 >> 0x28);
                minRes.m_backend.data._M_elems._0_8_ =
                     *(undefined8 *)&pnVar19[iVar29].m_backend.data;
                minRes.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)(pnVar19[iVar29].m_backend.data._M_elems + 2);
                puVar2 = pnVar19[iVar29].m_backend.data._M_elems + 4;
                minRes.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                uVar18 = *(undefined8 *)(puVar2 + 2);
                minRes.m_backend.data._M_elems._24_5_ = SUB85(uVar18,0);
                minRes.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar18 >> 0x28);
                minRes.m_backend.exp = pnVar19[iVar29].m_backend.exp;
                minRes.m_backend.neg = pnVar19[iVar29].m_backend.neg;
                minRes.m_backend.fpclass = pnVar19[iVar29].m_backend.fpclass;
                minRes.m_backend.prec_elem = pnVar19[iVar29].m_backend.prec_elem;
                iVar29 = (pIVar38->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem[lVar36].idx;
                pnVar19 = (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar18 = *(undefined8 *)(pnVar19[iVar29].m_backend.data._M_elems + 8);
                maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar18,0);
                maxRes.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar18 >> 0x28);
                maxRes.m_backend.data._M_elems._0_8_ =
                     *(undefined8 *)&pnVar19[iVar29].m_backend.data;
                maxRes.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)(pnVar19[iVar29].m_backend.data._M_elems + 2);
                puVar2 = pnVar19[iVar29].m_backend.data._M_elems + 4;
                maxRes.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                uVar18 = *(undefined8 *)(puVar2 + 2);
                maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar18,0);
                maxRes.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar18 >> 0x28);
                maxRes.m_backend.exp = pnVar19[iVar29].m_backend.exp;
                maxRes.m_backend.neg = pnVar19[iVar29].m_backend.neg;
                maxRes.m_backend.fpclass = pnVar19[iVar29].m_backend.fpclass;
                maxRes.m_backend.prec_elem = pnVar19[iVar29].m_backend.prec_elem;
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             *)&updateRow,
                            (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.theitem +
                               (lp->
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set.thekey
                               [(pIVar38->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem[lVar36].idx].idx));
                lVar37 = 0;
                for (lVar40 = 0;
                    lVar40 < (pIVar42->data).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .memused; lVar40 = lVar40 + 1) {
                  iVar29 = *(int *)((long)(&((pIVar42->data).
                                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem)->val + 1) + lVar37);
                  if (iVar29 != (uint)local_940) {
                    iVar29 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)((lp->
                                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).
                                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .set.theitem +
                                      (lp->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .set.thekey[(int)uVar16].idx),iVar29);
                    pNVar17 = (pIVar42->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem;
                    lVar32 = (long)*(int *)((long)(&pNVar17->val + 1) + lVar37);
                    if (iVar29 < 0) {
                      local_680 = -1.0;
                      result.m_backend.fpclass = cpp_dec_float_finite;
                      result.m_backend.prec_elem = 10;
                      result.m_backend.data._M_elems[0] = 0;
                      result.m_backend.data._M_elems[1] = 0;
                      result.m_backend.data._M_elems[2] = 0;
                      result.m_backend.data._M_elems[3] = 0;
                      result.m_backend.data._M_elems[4] = 0;
                      result.m_backend.data._M_elems[5] = 0;
                      result.m_backend.data._M_elems._24_5_ = 0;
                      result.m_backend.data._M_elems[7]._1_3_ = 0;
                      result.m_backend.data._M_elems._32_5_ = 0;
                      result.m_backend._37_8_ = 0;
                      boost::multiprecision::default_ops::
                      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                                (&result.m_backend,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 (CONCAT44(updateRow.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           updateRow.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar41
                                 ),&local_680);
                      maxVal.m_backend.fpclass = cpp_dec_float_finite;
                      maxVal.m_backend.prec_elem = 10;
                      maxVal.m_backend.data._M_elems[0] = 0;
                      maxVal.m_backend.data._M_elems[1] = 0;
                      maxVal.m_backend.data._M_elems[2] = 0;
                      maxVal.m_backend.data._M_elems[3] = 0;
                      maxVal.m_backend.data._M_elems[4] = 0;
                      maxVal.m_backend.data._M_elems[5] = 0;
                      maxVal.m_backend.data._M_elems._24_5_ = 0;
                      maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                      maxVal.m_backend.data._M_elems._32_5_ = 0;
                      maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                      maxVal.m_backend.exp = 0;
                      maxVal.m_backend.neg = false;
                      boost::multiprecision::default_ops::
                      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (&maxVal.m_backend,&result.m_backend,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 ((long)(((pIVar42->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val).m_backend.data._M_elems + lVar37));
                      minVal.m_backend.fpclass = cpp_dec_float_finite;
                      minVal.m_backend.prec_elem = 10;
                      minVal.m_backend.data._M_elems[0] = 0;
                      minVal.m_backend.data._M_elems[1] = 0;
                      minVal.m_backend.data._M_elems[2] = 0;
                      minVal.m_backend.data._M_elems[3] = 0;
                      minVal.m_backend.data._M_elems[4] = 0;
                      minVal.m_backend.data._M_elems[5] = 0;
                      minVal.m_backend.data._M_elems._24_5_ = 0;
                      minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                      minVal.m_backend.data._M_elems._32_5_ = 0;
                      minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                      minVal.m_backend.exp = 0;
                      minVal.m_backend.neg = false;
                      boost::multiprecision::default_ops::
                      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (&minVal.m_backend,&maxVal.m_backend,&rhs.m_backend);
                      (*(lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._vptr_ClassArray[0x43])(lp,(ulong)uVar16,lVar32,&minVal,0);
                    }
                    else {
                      lVar22 = CONCAT44(updateRow.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        updateRow.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
                      result.m_backend.fpclass = cpp_dec_float_finite;
                      result.m_backend.prec_elem = 10;
                      result.m_backend.data._M_elems[0] = 0;
                      result.m_backend.data._M_elems[1] = 0;
                      result.m_backend.data._M_elems[2] = 0;
                      result.m_backend.data._M_elems[3] = 0;
                      result.m_backend.data._M_elems[4] = 0;
                      result.m_backend.data._M_elems[5] = 0;
                      result.m_backend.data._M_elems._24_5_ = 0;
                      result.m_backend.data._M_elems[7]._1_3_ = 0;
                      result.m_backend.data._M_elems._32_5_ = 0;
                      result.m_backend._37_8_ = 0;
                      boost::multiprecision::default_ops::
                      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (&result.m_backend,
                                 (cpp_dec_float<50U,_int,_void> *)(lVar22 + lVar41),
                                 (cpp_dec_float<50U,_int,_void> *)
                                 ((long)(pNVar17->val).m_backend.data._M_elems + lVar37));
                      maxVal.m_backend.fpclass = cpp_dec_float_finite;
                      maxVal.m_backend.prec_elem = 10;
                      maxVal.m_backend.data._M_elems[0] = 0;
                      maxVal.m_backend.data._M_elems[1] = 0;
                      maxVal.m_backend.data._M_elems[2] = 0;
                      maxVal.m_backend.data._M_elems[3] = 0;
                      maxVal.m_backend.data._M_elems[4] = 0;
                      maxVal.m_backend.data._M_elems[5] = 0;
                      maxVal.m_backend.data._M_elems._24_5_ = 0;
                      maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                      maxVal.m_backend.data._M_elems._32_5_ = 0;
                      maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                      maxVal.m_backend.exp = 0;
                      maxVal.m_backend.neg = false;
                      boost::multiprecision::default_ops::
                      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (&maxVal.m_backend,&result.m_backend,&rhs.m_backend);
                      minVal.m_backend.fpclass = cpp_dec_float_finite;
                      minVal.m_backend.prec_elem = 10;
                      minVal.m_backend.data._M_elems[0] = 0;
                      minVal.m_backend.data._M_elems[1] = 0;
                      minVal.m_backend.data._M_elems[2] = 0;
                      minVal.m_backend.data._M_elems[3] = 0;
                      minVal.m_backend.data._M_elems[4] = 0;
                      minVal.m_backend.data._M_elems[5] = 0;
                      minVal.m_backend.data._M_elems._24_5_ = 0;
                      minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                      minVal.m_backend.data._M_elems._32_5_ = 0;
                      minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                      minVal.m_backend.exp = 0;
                      minVal.m_backend.neg = false;
                      boost::multiprecision::default_ops::
                      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (&minVal.m_backend,
                                 (cpp_dec_float<50U,_int,_void> *)(lVar22 + lVar32 * 0x38),
                                 &maxVal.m_backend);
                      (*(lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._vptr_ClassArray[0x43])(lp,(ulong)uVar16,lVar32);
                    }
                  }
                  lVar37 = lVar37 + 0x3c;
                }
                pnVar19 = (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pdVar30 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>(&minVal.m_backend,*pdVar30,(type *)0x0);
                tVar24 = boost::multiprecision::operator<
                                   (pnVar19 + (int)uVar16,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&minVal.m_backend);
                if (tVar24) {
                  result.m_backend.fpclass = cpp_dec_float_finite;
                  result.m_backend.prec_elem = 10;
                  result.m_backend.data._M_elems[0] = 0;
                  result.m_backend.data._M_elems[1] = 0;
                  result.m_backend.data._M_elems[2] = 0;
                  result.m_backend.data._M_elems[3] = 0;
                  result.m_backend.data._M_elems[4] = 0;
                  result.m_backend.data._M_elems[5] = 0;
                  result.m_backend.data._M_elems._24_5_ = 0;
                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                  result.m_backend.data._M_elems._32_5_ = 0;
                  result.m_backend._37_8_ = 0;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&result.m_backend,
                             (cpp_dec_float<50U,_int,_void> *)
                             (CONCAT44(updateRow.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       updateRow.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar41),
                             &lhs.m_backend);
                  maxVal.m_backend.fpclass = cpp_dec_float_finite;
                  maxVal.m_backend.prec_elem = 10;
                  maxVal.m_backend.data._M_elems[0] = 0;
                  maxVal.m_backend.data._M_elems[1] = 0;
                  maxVal.m_backend.data._M_elems[2] = 0;
                  maxVal.m_backend.data._M_elems[3] = 0;
                  maxVal.m_backend.data._M_elems[4] = 0;
                  maxVal.m_backend.data._M_elems[5] = 0;
                  maxVal.m_backend.data._M_elems._24_5_ = 0;
                  maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  maxVal.m_backend.data._M_elems._32_5_ = 0;
                  maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  maxVal.m_backend.exp = 0;
                  maxVal.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&maxVal.m_backend,&result.m_backend,&rhs.m_backend);
                  minVal.m_backend.fpclass = cpp_dec_float_finite;
                  minVal.m_backend.prec_elem = 10;
                  minVal.m_backend.data._M_elems[0] = 0;
                  minVal.m_backend.data._M_elems[1] = 0;
                  minVal.m_backend.data._M_elems[2] = 0;
                  minVal.m_backend.data._M_elems[3] = 0;
                  minVal.m_backend.data._M_elems[4] = 0;
                  minVal.m_backend.data._M_elems[5] = 0;
                  minVal.m_backend.data._M_elems._24_5_ = 0;
                  minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  minVal.m_backend.data._M_elems._32_5_ = 0;
                  minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  minVal.m_backend.exp = 0;
                  minVal.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&minVal.m_backend,&minRes.m_backend,&maxVal.m_backend);
                  (*(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x36])(lp,(ulong)uVar16,&minVal.m_backend,0);
                }
                pnVar19 = (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pdVar30 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>(&minVal.m_backend,-*pdVar30,(type *)0x0);
                tVar24 = boost::multiprecision::operator>
                                   (pnVar19 + (int)uVar16,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&minVal.m_backend);
                if (tVar24) {
                  result.m_backend.fpclass = cpp_dec_float_finite;
                  result.m_backend.prec_elem = 10;
                  result.m_backend.data._M_elems[0] = 0;
                  result.m_backend.data._M_elems[1] = 0;
                  result.m_backend.data._M_elems[2] = 0;
                  result.m_backend.data._M_elems[3] = 0;
                  result.m_backend.data._M_elems[4] = 0;
                  result.m_backend.data._M_elems[5] = 0;
                  result.m_backend.data._M_elems._24_5_ = 0;
                  result.m_backend.data._M_elems[7]._1_3_ = 0;
                  result.m_backend.data._M_elems._32_5_ = 0;
                  result.m_backend._37_8_ = 0;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&result.m_backend,
                             (cpp_dec_float<50U,_int,_void> *)
                             (CONCAT44(updateRow.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       updateRow.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar41),
                             &lhs.m_backend);
                  maxVal.m_backend.fpclass = cpp_dec_float_finite;
                  maxVal.m_backend.prec_elem = 10;
                  maxVal.m_backend.data._M_elems[0] = 0;
                  maxVal.m_backend.data._M_elems[1] = 0;
                  maxVal.m_backend.data._M_elems[2] = 0;
                  maxVal.m_backend.data._M_elems[3] = 0;
                  maxVal.m_backend.data._M_elems[4] = 0;
                  maxVal.m_backend.data._M_elems[5] = 0;
                  maxVal.m_backend.data._M_elems._24_5_ = 0;
                  maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  maxVal.m_backend.data._M_elems._32_5_ = 0;
                  maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  maxVal.m_backend.exp = 0;
                  maxVal.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&maxVal.m_backend,&result.m_backend,&rhs.m_backend);
                  minVal.m_backend.fpclass = cpp_dec_float_finite;
                  minVal.m_backend.prec_elem = 10;
                  minVal.m_backend.data._M_elems[0] = 0;
                  minVal.m_backend.data._M_elems[1] = 0;
                  minVal.m_backend.data._M_elems[2] = 0;
                  minVal.m_backend.data._M_elems[3] = 0;
                  minVal.m_backend.data._M_elems[4] = 0;
                  minVal.m_backend.data._M_elems[5] = 0;
                  minVal.m_backend.data._M_elems._24_5_ = 0;
                  minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  minVal.m_backend.data._M_elems._32_5_ = 0;
                  minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  minVal.m_backend.exp = 0;
                  minVal.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&minVal.m_backend,&maxRes.m_backend,&maxVal.m_backend);
                  (*(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x33])(lp,(ulong)uVar16,&minVal.m_backend,0);
                }
                std::
                _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)&updateRow);
                pIVar38 = local_950;
              }
            }
            lVar36 = 0;
            for (lVar41 = 0; pSVar23 = local_948,
                lVar41 < (pIVar42->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused; lVar41 = lVar41 + 1) {
              pNVar17 = (pIVar42->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem;
              uVar16 = *(uint *)((long)(&pNVar17->val + 1) + lVar36);
              if (uVar16 != (uint)local_940) {
                pnVar19 = (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                minVal.m_backend.fpclass = cpp_dec_float_finite;
                minVal.m_backend.prec_elem = 10;
                minVal.m_backend.data._M_elems[0] = 0;
                minVal.m_backend.data._M_elems[1] = 0;
                minVal.m_backend.data._M_elems[2] = 0;
                minVal.m_backend.data._M_elems[3] = 0;
                minVal.m_backend.data._M_elems[4] = 0;
                minVal.m_backend.data._M_elems[5] = 0;
                minVal.m_backend.data._M_elems._24_5_ = 0;
                minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                minVal.m_backend.data._M_elems._32_5_ = 0;
                minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                minVal.m_backend.exp = 0;
                minVal.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&minVal.m_backend,&pnVar19[uVar39].m_backend,
                           (cpp_dec_float<50U,_int,_void> *)
                           ((long)(pNVar17->val).m_backend.data._M_elems + lVar36));
                maxRes.m_backend.fpclass = cpp_dec_float_finite;
                maxRes.m_backend.prec_elem = 10;
                maxRes.m_backend.data._M_elems[0] = 0;
                maxRes.m_backend.data._M_elems[1] = 0;
                maxRes.m_backend.data._M_elems[2] = 0;
                maxRes.m_backend.data._M_elems[3] = 0;
                maxRes.m_backend.data._M_elems[4] = 0;
                maxRes.m_backend.data._M_elems[5] = 0;
                maxRes.m_backend.data._M_elems._24_5_ = 0;
                maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                maxRes.m_backend.data._M_elems._32_5_ = 0;
                maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                maxRes.m_backend.exp = 0;
                maxRes.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&maxRes.m_backend,&minVal.m_backend,&rhs.m_backend);
                minRes.m_backend.fpclass = cpp_dec_float_finite;
                minRes.m_backend.prec_elem = 10;
                minRes.m_backend.data._M_elems[0] = 0;
                minRes.m_backend.data._M_elems[1] = 0;
                minRes.m_backend.data._M_elems[2] = 0;
                minRes.m_backend.data._M_elems[3] = 0;
                minRes.m_backend.data._M_elems[4] = 0;
                minRes.m_backend.data._M_elems[5] = 0;
                minRes.m_backend.data._M_elems._24_5_ = 0;
                minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                minRes.m_backend.data._M_elems._32_5_ = 0;
                minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                minRes.m_backend.exp = 0;
                minRes.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&minRes.m_backend,&pnVar19[(int)uVar16].m_backend,&maxRes.m_backend);
                (*(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x27])(lp,(ulong)uVar16,&minRes.m_backend,0);
              }
              lVar36 = lVar36 + 0x3c;
            }
            iVar29 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem
                     [(lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[uVar39].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            removeCol(local_948,lp,(uint)local_940);
            iVar28 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem
                     [(lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[uVar34].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            removeRow(pSVar23,lp,uVar34);
            local_858 = local_858 + 1;
            local_85c = local_85c + 1;
            t = t + iVar29 + iVar28;
            piVar1 = (pSVar23->m_stat).data + 0x10;
            *piVar1 = *piVar1 + 1;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          break;
        }
LAB_002a25cf:
        if (tVar24 != false) {
          minVal.m_backend.fpclass = cpp_dec_float_finite;
          minVal.m_backend.prec_elem = 10;
          minVal.m_backend.data._M_elems[0] = 0;
          minVal.m_backend.data._M_elems[1] = 0;
          minVal.m_backend.data._M_elems[2] = 0;
          minVal.m_backend.data._M_elems[3] = 0;
          minVal.m_backend.data._M_elems[4] = 0;
          minVal.m_backend.data._M_elems[5] = 0;
          minVal.m_backend.data._M_elems._24_5_ = 0;
          minVal.m_backend.data._M_elems[7]._1_3_ = 0;
          minVal.m_backend.data._M_elems._32_5_ = 0;
          minVal.m_backend.data._M_elems[9]._1_3_ = 0;
          minVal.m_backend.exp = 0;
          minVal.m_backend.neg = false;
          maxVal.m_backend.fpclass = cpp_dec_float_finite;
          maxVal.m_backend.prec_elem = 10;
          maxVal.m_backend.data._M_elems[0] = 0;
          maxVal.m_backend.data._M_elems[1] = 0;
          maxVal.m_backend.data._M_elems[2] = 0;
          maxVal.m_backend.data._M_elems[3] = 0;
          maxVal.m_backend.data._M_elems[4] = 0;
          maxVal.m_backend.data._M_elems[5] = 0;
          maxVal.m_backend.data._M_elems._24_5_ = 0;
          maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
          maxVal.m_backend.data._M_elems._32_5_ = 0;
          maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
          maxVal.m_backend.exp = 0;
          maxVal.m_backend.neg = false;
          local_2c8.m_backend.data._M_elems[7]._1_3_ = rhs.m_backend.data._M_elems[7]._1_3_;
          local_2c8.m_backend.data._M_elems._24_5_ = rhs.m_backend.data._M_elems._24_5_;
          local_2c8.m_backend.data._M_elems[0] = rhs.m_backend.data._M_elems[0];
          local_2c8.m_backend.data._M_elems[1] = rhs.m_backend.data._M_elems[1];
          local_2c8.m_backend.data._M_elems[2] = rhs.m_backend.data._M_elems[2];
          local_2c8.m_backend.data._M_elems[3] = rhs.m_backend.data._M_elems[3];
          local_2c8.m_backend.data._M_elems[4] = rhs.m_backend.data._M_elems[4];
          local_2c8.m_backend.data._M_elems[5] = rhs.m_backend.data._M_elems[5];
          local_2c8.m_backend.data._M_elems[9]._1_3_ = rhs.m_backend.data._M_elems[9]._1_3_;
          local_2c8.m_backend.data._M_elems._32_5_ = rhs.m_backend.data._M_elems._32_5_;
          local_2c8.m_backend.exp = rhs.m_backend.exp;
          local_2c8.m_backend.neg = rhs.m_backend.neg;
          local_2c8.m_backend.fpclass = rhs.m_backend.fpclass;
          local_2c8.m_backend.prec_elem = rhs.m_backend.prec_elem;
          local_588 = ptr.
                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
          p_Stack_580 = ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_308.m_backend.data._M_elems[9]._1_3_ = minRes.m_backend.data._M_elems[9]._1_3_;
          local_308.m_backend.data._M_elems._32_5_ = minRes.m_backend.data._M_elems._32_5_;
          local_308.m_backend.data._M_elems[7]._1_3_ = minRes.m_backend.data._M_elems[7]._1_3_;
          local_308.m_backend.data._M_elems._24_5_ = minRes.m_backend.data._M_elems._24_5_;
          local_308.m_backend.data._M_elems[4] = minRes.m_backend.data._M_elems[4];
          local_308.m_backend.data._M_elems[5] = minRes.m_backend.data._M_elems[5];
          local_308.m_backend.data._M_elems[0] = minRes.m_backend.data._M_elems[0];
          local_308.m_backend.data._M_elems[1] = minRes.m_backend.data._M_elems[1];
          local_308.m_backend.data._M_elems[2] = minRes.m_backend.data._M_elems[2];
          local_308.m_backend.data._M_elems[3] = minRes.m_backend.data._M_elems[3];
          local_308.m_backend.exp = minRes.m_backend.exp;
          local_308.m_backend.neg = minRes.m_backend.neg;
          local_308.m_backend.fpclass = minRes.m_backend.fpclass;
          local_308.m_backend.prec_elem = minRes.m_backend.prec_elem;
          local_348.m_backend.data._M_elems[9]._1_3_ = maxRes.m_backend.data._M_elems[9]._1_3_;
          local_348.m_backend.data._M_elems._32_5_ = maxRes.m_backend.data._M_elems._32_5_;
          local_348.m_backend.data._M_elems[7]._1_3_ = maxRes.m_backend.data._M_elems[7]._1_3_;
          local_348.m_backend.data._M_elems._24_5_ = maxRes.m_backend.data._M_elems._24_5_;
          local_348.m_backend.data._M_elems[4] = maxRes.m_backend.data._M_elems[4];
          local_348.m_backend.data._M_elems[5] = maxRes.m_backend.data._M_elems[5];
          local_348.m_backend.data._M_elems[0] = maxRes.m_backend.data._M_elems[0];
          local_348.m_backend.data._M_elems[1] = maxRes.m_backend.data._M_elems[1];
          local_348.m_backend.data._M_elems[2] = maxRes.m_backend.data._M_elems[2];
          local_348.m_backend.data._M_elems[3] = maxRes.m_backend.data._M_elems[3];
          local_348.m_backend.exp = maxRes.m_backend.exp;
          local_348.m_backend.neg = maxRes.m_backend.neg;
          local_348.m_backend.fpclass = maxRes.m_backend.fpclass;
          local_348.m_backend.prec_elem = maxRes.m_backend.prec_elem;
          local_578 = (uint  [2])uVar20;
          auStack_570 = (uint  [2])uVar21;
          local_568 = (uint  [2])uVar18;
          local_560 = iVar12;
          local_55c = (bool)uVar6;
          local_558 = fVar13;
          local_554 = iVar14;
          computeMinMaxValues(local_948,lp,&local_2c8,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_588,&local_308,&local_348,&minVal,&maxVal);
          pdVar30 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,-*pdVar30,(type *)0x0);
          tVar24 = boost::multiprecision::operator>(&minVal,&result);
          if (tVar24) {
            local_388.m_backend.data._M_elems[9]._1_3_ = minVal.m_backend.data._M_elems[9]._1_3_;
            local_388.m_backend.data._M_elems._32_5_ = minVal.m_backend.data._M_elems._32_5_;
            local_388.m_backend.data._M_elems[7]._1_3_ = minVal.m_backend.data._M_elems[7]._1_3_;
            local_388.m_backend.data._M_elems._24_5_ = minVal.m_backend.data._M_elems._24_5_;
            local_388.m_backend.data._M_elems[4] = minVal.m_backend.data._M_elems[4];
            local_388.m_backend.data._M_elems[5] = minVal.m_backend.data._M_elems[5];
            local_388.m_backend.data._M_elems[0] = minVal.m_backend.data._M_elems[0];
            local_388.m_backend.data._M_elems[1] = minVal.m_backend.data._M_elems[1];
            local_388.m_backend.data._M_elems[2] = minVal.m_backend.data._M_elems[2];
            local_388.m_backend.data._M_elems[3] = minVal.m_backend.data._M_elems[3];
            local_388.m_backend.exp = minVal.m_backend.exp;
            local_388.m_backend.neg = minVal.m_backend.neg;
            local_388.m_backend.fpclass = minVal.m_backend.fpclass;
            local_388.m_backend.prec_elem = minVal.m_backend.prec_elem;
            local_5c8.m_backend.data._M_elems[0] = local_648[0];
            local_5c8.m_backend.data._M_elems[1] = local_648[1];
            local_5c8.m_backend.data._M_elems[2] = auStack_640[0];
            local_5c8.m_backend.data._M_elems[3] = auStack_640[1];
            local_5c8.m_backend.data._M_elems[4] = local_638[0];
            local_5c8.m_backend.data._M_elems[5] = local_638[1];
            local_5c8.m_backend.data._M_elems[6] = auStack_630[0];
            local_5c8.m_backend.data._M_elems[7] = auStack_630[1];
            local_5c8.m_backend.data._M_elems[8] = local_628[0];
            local_5c8.m_backend.data._M_elems[9] = local_628[1];
            local_5c8.m_backend.exp = iVar29;
            local_5c8.m_backend.neg = bVar4;
            local_5c8.m_backend.fpclass = fVar8;
            local_5c8.m_backend.prec_elem = iVar9;
            feastol(&local_110,local_948);
            bVar25 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               (&local_388,&local_5c8,&local_110);
            if (bVar25) {
              pdVar30 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        ((cpp_dec_float<50U,_int,_void> *)&updateRow,*pdVar30,(type *)0x0);
              tVar24 = boost::multiprecision::operator<
                                 (&maxVal,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)&updateRow);
              if (tVar24) {
                local_3c8.m_backend.data._M_elems[9]._1_3_ = maxVal.m_backend.data._M_elems[9]._1_3_
                ;
                local_3c8.m_backend.data._M_elems._32_5_ = maxVal.m_backend.data._M_elems._32_5_;
                local_3c8.m_backend.data._M_elems[7]._1_3_ = maxVal.m_backend.data._M_elems[7]._1_3_
                ;
                local_3c8.m_backend.data._M_elems._24_5_ = maxVal.m_backend.data._M_elems._24_5_;
                local_3c8.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
                local_3c8.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
                local_3c8.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
                local_3c8.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
                local_3c8.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
                local_3c8.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
                local_3c8.m_backend.exp = maxVal.m_backend.exp;
                local_3c8.m_backend.neg = maxVal.m_backend.neg;
                local_3c8.m_backend.fpclass = maxVal.m_backend.fpclass;
                local_3c8.m_backend.prec_elem = maxVal.m_backend.prec_elem;
                local_608.m_backend.data._M_elems[0] = local_678[0];
                local_608.m_backend.data._M_elems[1] = local_678[1];
                local_608.m_backend.data._M_elems[2] = auStack_670[0];
                local_608.m_backend.data._M_elems[3] = auStack_670[1];
                local_608.m_backend.data._M_elems[4] = local_668[0];
                local_608.m_backend.data._M_elems[5] = local_668[1];
                local_608.m_backend.data._M_elems[6] = auStack_660[0];
                local_608.m_backend.data._M_elems[7] = auStack_660[1];
                local_608.m_backend.data._M_elems[8] = local_658[0];
                local_608.m_backend.data._M_elems[9] = local_658[1];
                local_608.m_backend.exp = iVar28;
                local_608.m_backend.neg = bVar5;
                local_608.m_backend.fpclass = fVar10;
                local_608.m_backend.prec_elem = iVar11;
                feastol(&local_148,local_948);
                bVar25 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                   (&local_3c8,&local_608,&local_148);
                if (bVar25) {
                  uVar34 = *(uint *)((long)(&((local_950->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             .m_elem)->val + 1) + lVar40);
                  bVar4 = false;
                  goto LAB_002a2a4d;
                }
              }
            }
          }
        }
      }
LAB_002a2a19:
      lVar40 = lVar40 + 0x3c;
    }
  }
  goto LAB_002a1789;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}